

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_13::PoppifyFunctionsPass::runOnFunction
          (PoppifyFunctionsPass *this,Module *module,Function *func)

{
  size_t in_RCX;
  void *__buf;
  Poppifier local_c0;
  Function *local_20;
  Function *func_local;
  Module *module_local;
  PoppifyFunctionsPass *this_local;
  
  if (func->profile != Poppy) {
    local_20 = func;
    func_local = (Function *)module;
    module_local = (Module *)this;
    Poppifier::Poppifier(&local_c0,func,module);
    BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::write
              (&local_c0.super_BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>,(int)func,
               __buf,in_RCX);
    Poppifier::~Poppifier(&local_c0);
    local_20->profile = Poppy;
  }
  return;
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    if (func->profile != IRProfile::Poppy) {
      Poppifier(func, module).write();
      func->profile = IRProfile::Poppy;
    }
  }